

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::NextSubpass
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  COMMAND_QUEUE_TYPE CVar1;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  Uint32 SubpassIndex;
  char (*in_R9) [8];
  string msg;
  string local_50;
  String local_30;
  
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_50,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"NextSubpass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5f1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_50,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5f1);
    in_DL = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      in_DL = extraout_DL_00;
    }
  }
  CVar1 = (this->m_Desc).QueueType;
  if ((~CVar1 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_30,(Diligent *)(ulong)CVar1,in_DL);
    FormatString<char[12],char[22],std::__cxx11::string,char[8]>
              (&local_50,(Diligent *)0x6e1388,(char (*) [12])0x7699da,(char (*) [22])&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5f1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pActiveRenderPass).m_pObject == (RenderPassVkImpl *)0x0) {
    FormatString<char[31]>(&local_50,(char (*) [31])"There is no active render pass");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5f2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((this->m_pActiveRenderPass).m_pObject)->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <= this->m_SubpassIndex + 1) {
    FormatString<char[54]>
              (&local_50,(char (*) [54])"The render pass has reached the final subpass already");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5f3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  SubpassIndex = this->m_SubpassIndex + 1;
  this->m_SubpassIndex = SubpassIndex;
  UpdateAttachmentStates(this,SubpassIndex);
  SetSubpassRenderTargets(this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::NextSubpass()
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "NextSubpass");
    DEV_CHECK_ERR(m_pActiveRenderPass != nullptr, "There is no active render pass");
    VERIFY(m_SubpassIndex + 1 < m_pActiveRenderPass->GetDesc().SubpassCount, "The render pass has reached the final subpass already");
    ++m_SubpassIndex;
    UpdateAttachmentStates(m_SubpassIndex);
    SetSubpassRenderTargets();
}